

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

int __thiscall QDialog::exec(QDialog *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  QDialogPrivate *pQVar4;
  QPlatformDialogHelper *pQVar5;
  QDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int res;
  bool wasShowModal;
  bool deleteOnClose;
  QDialogPrivate *d;
  QEventLoop eventLoop;
  QPointer<QDialog> guard;
  undefined4 in_stack_ffffffffffffff68;
  ProcessEventsFlag in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  WidgetAttribute in_stack_ffffffffffffff74;
  QWidget *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar6;
  int local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 *puVar7;
  QWidget *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QDialog *)0x743bd0);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QEventLoop> *)0x743be6);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning(&stack0xffffffffffffffd8,"QDialog::exec: Recursive call detected");
    local_50 = -1;
  }
  else {
    bVar2 = QWidget::testAttribute(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    QWidget::setAttribute
              (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
    QDialogPrivate::resetModalitySetByOpen
              ((QDialogPrivate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    QWidget::testAttribute(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    QWidget::setAttribute
              (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
    setResult((QDialog *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff6c);
    QWidget::show((QWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puVar7 = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QDialog>::QPointer<void>
              ((QPointer<QDialog> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (QDialog *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if ((pQVar4->nativeDialogInUse & 1U) == 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEventLoop::QEventLoop((QEventLoop *)&local_48,(QObject *)0x0);
      QPointer<QEventLoop>::operator=
                ((QPointer<QEventLoop> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (QEventLoop *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QFlags<QEventLoop::ProcessEventsFlag>::QFlags
                ((QFlags<QEventLoop::ProcessEventsFlag> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
      QEventLoop::exec((QFlags_conflict1 *)&local_48);
      QEventLoop::~QEventLoop((QEventLoop *)&local_48);
    }
    else {
      pQVar5 = QDialogPrivate::platformHelper(in_RDI);
      (**(code **)(*(long *)pQVar5 + 0x68))();
    }
    bVar3 = QPointer<QDialog>::isNull((QPointer<QDialog> *)0x743d49);
    if (bVar3) {
      local_50 = 0;
    }
    else {
      QPointer<QEventLoop>::operator=
                ((QPointer<QEventLoop> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (QEventLoop *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QWidget::setAttribute
                (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)puVar7 >> 0x20),
                 SUB81((ulong)puVar7 >> 0x18,0));
      local_50 = result((QDialog *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if ((pQVar4->nativeDialogInUse & 1U) != 0) {
        iVar6 = local_50;
        pQVar5 = QDialogPrivate::platformHelper(in_RDI);
        (**(code **)(*(long *)&pQVar4->super_QWidgetPrivate + 200))(pQVar4,iVar6,pQVar5);
      }
      if ((bVar2) && (in_RDI != (QDialogPrivate *)0x0)) {
        (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x20))();
      }
    }
    QPointer<QDialog>::~QPointer((QPointer<QDialog> *)0x743e17);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

int QDialog::exec()
{
    Q_D(QDialog);

    if (Q_UNLIKELY(d->eventLoop)) {
        qWarning("QDialog::exec: Recursive call detected");
        return -1;
    }

    bool deleteOnClose = testAttribute(Qt::WA_DeleteOnClose);
    setAttribute(Qt::WA_DeleteOnClose, false);

    d->resetModalitySetByOpen();

    bool wasShowModal = testAttribute(Qt::WA_ShowModal);
    setAttribute(Qt::WA_ShowModal, true);
    setResult(0);

    show();

    QPointer<QDialog> guard = this;
    if (d->nativeDialogInUse) {
        d->platformHelper()->exec();
    } else {
        QEventLoop eventLoop;
        d->eventLoop = &eventLoop;
        (void) eventLoop.exec(QEventLoop::DialogExec);
    }
    if (guard.isNull())
        return QDialog::Rejected;
    d->eventLoop = nullptr;

    setAttribute(Qt::WA_ShowModal, wasShowModal);

    int res = result();
    if (d->nativeDialogInUse)
        d->helperDone(static_cast<QDialog::DialogCode>(res), d->platformHelper());
    if (deleteOnClose)
        delete this;
    return res;
}